

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

int64_t anon_unknown.dwarf_50b73::GetSourceSampleOffset
                  (ALsource *Source,ALCcontext *context,nanoseconds *clocktime)

{
  ALCdevice *this;
  ALuint AVar1;
  Voice *pVVar2;
  __pointer_type pBVar3;
  ulong uVar4;
  
  this = (context->mDevice).mPtr;
  do {
    while( true ) {
      AVar1 = ALCdevice::waitForMix(this);
      clocktime->__r =
           ((ulong)this->SamplesDone * 1000000000) / (ulong)this->Frequency + (this->ClockBase).__r;
      pVVar2 = GetSourceVoice(Source,context);
      if (pVVar2 != (Voice *)0x0) break;
      if (AVar1 == (this->MixCount).super___atomic_base<unsigned_int>._M_i) {
        return 0;
      }
    }
  } while (AVar1 != (this->MixCount).super___atomic_base<unsigned_int>._M_i);
  uVar4 = (ulong)(pVVar2->mPositionFrac).super___atomic_base<unsigned_int>._M_i << 0x14 |
          (ulong)(pVVar2->mPosition).super___atomic_base<unsigned_int>._M_i << 0x20;
  for (pBVar3 = Source->queue;
      (pBVar3 != (__pointer_type)0x0 && (pBVar3 != (pVVar2->mCurrentBuffer)._M_b._M_p));
      pBVar3 = (pBVar3->mNext)._M_b._M_p) {
    uVar4 = uVar4 + ((ulong)pBVar3->mSampleLen << 0x20);
  }
  if (0x7ffffffffffffffe < uVar4) {
    return 0x7fffffffffffffff;
  }
  return uVar4;
}

Assistant:

int64_t GetSourceSampleOffset(ALsource *Source, ALCcontext *context, nanoseconds *clocktime)
{
    ALCdevice *device{context->mDevice.get()};
    const BufferlistItem *Current{};
    uint64_t readPos{};
    ALuint refcount;
    Voice *voice;

    do {
        refcount = device->waitForMix();
        *clocktime = GetDeviceClockTime(device);
        voice = GetSourceVoice(Source, context);
        if(voice)
        {
            Current = voice->mCurrentBuffer.load(std::memory_order_relaxed);

            readPos  = uint64_t{voice->mPosition.load(std::memory_order_relaxed)} << 32;
            readPos |= uint64_t{voice->mPositionFrac.load(std::memory_order_relaxed)} <<
                       (32-MixerFracBits);
        }
        std::atomic_thread_fence(std::memory_order_acquire);
    } while(refcount != device->MixCount.load(std::memory_order_relaxed));

    if(!voice)
        return 0;

    const BufferlistItem *BufferList{Source->queue};
    while(BufferList && BufferList != Current)
    {
        readPos += uint64_t{BufferList->mSampleLen} << 32;
        BufferList = BufferList->mNext.load(std::memory_order_relaxed);
    }
    return static_cast<int64_t>(minu64(readPos, 0x7fffffffffffffff_u64));
}